

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>::~ShaderVariableManagerBase
          (ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void> *this)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void> *this_local;
  
  if (this->m_pVariables != (void *)0x0) {
    msg.field_2._8_8_ = this;
    FormatString<char[69]>
              ((string *)local_30,
               (char (*) [69])"Destroy() has not been called. The shader variable memory will leak."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"~ShaderVariableManagerBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x340);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

~ShaderVariableManagerBase()
    {
        VERIFY(m_pVariables == nullptr, "Destroy() has not been called. The shader variable memory will leak.");
    }